

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O3

learner<char,_example> *
LEARNER::init_learner<char,example,LEARNER::learner<char,char>>
          (_func_void_char_ptr_learner<char,_char>_ptr_example_ptr *predict,size_t params_per_weight
          )

{
  learner<char,_example> *plVar1;
  
  plVar1 = calloc_or_throw<LEARNER::learner<char,example>>(1);
  *(undefined8 *)(plVar1 + 0xd8) = 1;
  *(code **)(plVar1 + 0x98) = noop;
  *(code **)(plVar1 + 0xb0) = noop;
  *(code **)(plVar1 + 0x10) = noop;
  *(code **)(plVar1 + 0x80) = noop_sl;
  *(undefined8 *)(plVar1 + 0xb8) = 0;
  *(code **)(plVar1 + 200) = noop;
  *(code **)(plVar1 + 0x50) = noop_sensitivity;
  *(undefined8 *)(plVar1 + 0x58) = 0;
  *(code **)(plVar1 + 0x68) = return_simple_example;
  *(size_t *)(plVar1 + 0xe0) = params_per_weight;
  *(undefined8 *)(plVar1 + 0x18) = 0;
  *(_func_void_char_ptr_learner<char,_char>_ptr_example_ptr **)(plVar1 + 0x28) = predict;
  *(_func_void_char_ptr_learner<char,_char>_ptr_example_ptr **)(plVar1 + 0x38) = predict;
  *(_func_void_char_ptr_learner<char,_char>_ptr_example_ptr **)(plVar1 + 0x30) = predict;
  *(undefined8 *)(plVar1 + 0x40) = 0;
  *(undefined4 *)(plVar1 + 0xd0) = 0;
  plVar1[0xe8] = (learner<char,_example>)0x0;
  return plVar1;
}

Assistant:

learner<T, E>& init_learner(void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  return learner<T, E>::init_learner(
      nullptr, (L*)nullptr, predict, predict, params_per_weight, prediction_type::scalar);
}